

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O0

void iutest::Test::RecordProperty<char[2]>(string *key,char (*value) [2])

{
  string local_38;
  char (*local_18) [2];
  char (*value_local) [2];
  string *key_local;
  
  local_18 = value;
  value_local = (char (*) [2])key;
  PrintToString<char[2]>(&local_38,value);
  RecordPropertyString(key,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void RecordProperty(const ::std::string& key, const T& value)
    {
        RecordPropertyString(key, PrintToString(value));
    }